

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  int in_R9D;
  lzham_decompress_status_t status;
  lzham_decompressor *pState;
  lzham_decompressor *in_stack_00000478;
  lzham_decompressor *in_stack_00000488;
  lzham_decompress_status_t local_44;
  lzham_decompress_status_t local_4;
  
  if ((((in_RDI == 0) || (*(int *)(in_RDI + 0x13c) == 0)) || (in_RDX == (long *)0x0)) ||
     (in_R8 == (long *)0x0)) {
    local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  else if ((*in_RDX == 0) || (in_RSI != 0)) {
    if ((*in_R8 == 0) || (in_RCX != 0)) {
      *(long *)(in_RDI + 0x100) = in_RSI;
      *(long **)(in_RDI + 0x108) = in_RDX;
      *(long *)(in_RDI + 0x110) = in_RCX;
      *(long **)(in_RDI + 0x118) = in_R8;
      *(bool *)(in_RDI + 0x120) = in_R9D != 0;
      if ((*(uint *)(in_RDI + 0x144) & 1) != 0) {
        if (*(long *)(in_RDI + 0x128) == 0) {
          *(long *)(in_RDI + 0x128) = in_RCX;
          *(long *)(in_RDI + 0x130) = *in_R8;
        }
        else if ((*(long *)(in_RDI + 0x128) != in_RCX) || (*(long *)(in_RDI + 0x130) != *in_R8)) {
          return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
        }
      }
      if ((*(uint *)(in_RDI + 0x144) & 1) == 0) {
        local_44 = lzham_decompressor::decompress<false>(in_stack_00000488);
      }
      else {
        local_44 = lzham_decompressor::decompress<true>(in_stack_00000478);
      }
      local_4 = local_44;
    }
    else {
      local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
  }
  else {
    local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

lzham_decompress_status_t LZHAM_CDECL lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            // In unbuffered mode, the caller is not allowed to move the output buffer and the output pointer MUST always point to the beginning of the output buffer.
            // Also, the output buffer size must indicate the full size of the output buffer. The decompressor will track the current output offset, and during partial/sync
            // flushes it'll report how many bytes it has written since the call. 
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;

      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();
      
      return status;
   }